

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

int __thiscall GrcSymbolTableEntry::GlyphMetricEngineCodeOp(GrcSymbolTableEntry *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  long in_RDI;
  string staField2;
  string staField1;
  string staField0;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  string local_80 [20];
  int in_stack_ffffffffffffff94;
  GrcSymbolTableEntry *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [24];
  GrcSymbolTableEntry *in_stack_ffffffffffffffe8;
  int local_4;
  
  if (((*(byte *)(in_RDI + 0x80) & 1) == 0) && (*(long *)(in_RDI + 0x78) != 0)) {
    iVar4 = GlyphMetricEngineCodeOp(in_stack_ffffffffffffffe8);
    return iVar4;
  }
  FieldAt_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  FieldAt_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  FieldAt_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,
                                   CONCAT16(in_stack_ffffffffffffff66,
                                            CONCAT15(in_stack_ffffffffffffff65,
                                                     CONCAT14(in_stack_ffffffffffffff64,
                                                              in_stack_ffffffffffffff60)))),
                          in_stack_ffffffffffffff58);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff67,
                                     CONCAT16(in_stack_ffffffffffffff66,
                                              CONCAT15(in_stack_ffffffffffffff65,
                                                       CONCAT14(in_stack_ffffffffffffff64,
                                                                in_stack_ffffffffffffff60)))),
                            in_stack_ffffffffffffff58);
    if (bVar1) {
      local_4 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff67,
                                       CONCAT16(in_stack_ffffffffffffff66,
                                                CONCAT15(in_stack_ffffffffffffff65,
                                                         CONCAT14(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60)))),
                              in_stack_ffffffffffffff58);
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 2;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 3;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 4;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 5;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 7;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 6;
          goto LAB_001ca737;
        }
      }
      else {
        uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   CONCAT15(in_stack_ffffffffffffff65,
                                                            CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if ((bool)uVar2) {
          local_4 = 8;
          goto LAB_001ca737;
        }
        uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff65,
                                                                  CONCAT14(in_stack_ffffffffffffff64
                                                                           ,
                                                  in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if ((bool)uVar3) {
          local_4 = 9;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 10;
          goto LAB_001ca737;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(bVar1,
                                                  in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_4 = 0xb;
          goto LAB_001ca737;
        }
      }
      local_4 = -1;
    }
  }
LAB_001ca737:
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int GrcSymbolTableEntry::GlyphMetricEngineCodeOp()
{
	if (!m_fGeneric && m_psymGeneric)
		return m_psymGeneric->GlyphMetricEngineCodeOp();

	Assert(FitsSymbolType(ksymtGlyphMetric)) ;

	std::string staField0 = FieldAt(0);
	std::string staField1 = FieldAt(1);
	std::string staField2 = FieldAt(2);

	if (staField0 == "leftsidebearing")
	{
		return kgmetLsb;
	}
	else if (staField0 == "rightsidebearing")
	{
		return kgmetRsb;
	}
	else if (staField0 == "boundingbox")
	{
		if (staField1 == "top")
			return kgmetBbTop;
		else if (staField1 == "bottom")
			return kgmetBbBottom;
		else if (staField1 == "left")
			return kgmetBbLeft;
		else if (staField1 == "right")
			return kgmetBbRight;
		else if (staField1 == "width")
			return kgmetBbWidth;
		else if (staField1 == "height")
			return kgmetBbHeight;
		else
		{
			Assert(false);
		}
	}
	else if (staField0 == "advancewidth")
	{
		return kgmetAdvWidth;
	}
	else if (staField0 == "advanceheight")
	{
		return kgmetAdvHeight;
	}
//	else if (staField0 == "advance")
//	{
//		if (staField1 == "width")
//			return kgmetAdvWidth;
//		else if (staField1 == "height")
//			return kgmetAdvHeight;
//		else
//			Assert(false);
//	}
	else if (staField0 == "ascent")
	{
		return kgmetAscent;
	}
	else if (staField0 == "descent")
	{
		return kgmetDescent;
	}
	else
	{
		Assert(false);
    }
	return -1;
}